

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScalePlaneDown4
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int row_stride;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_int *ScaleRowDown4;
  int y;
  code *local_58;
  undefined8 in_stack_ffffffffffffffb0;
  int test_flag;
  code *local_48;
  code *local_40;
  code *local_38;
  code *local_28;
  int local_1c;
  int local_14;
  
  if (in_stack_00000018 == 0) {
    local_38 = ScaleRowDown4_C;
  }
  else {
    local_38 = ScaleRowDown4Box_C;
  }
  local_28 = local_38;
  local_14 = in_R8D;
  if (in_stack_00000018 == 0) {
    in_stack_00000008 = in_stack_00000008 + (in_R8D << 1);
    local_14 = 0;
  }
  test_flag = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  iVar1 = TestCpuFlag(test_flag);
  if (iVar1 != 0) {
    if (in_stack_00000018 == 0) {
      local_40 = ScaleRowDown4_Any_SSSE3;
    }
    else {
      local_40 = ScaleRowDown4Box_Any_SSSE3;
    }
    local_28 = local_40;
    if ((in_EDX & 7) == 0) {
      if (in_stack_00000018 == 0) {
        local_48 = ScaleRowDown4_SSSE3;
      }
      else {
        local_48 = ScaleRowDown4Box_SSSE3;
      }
      local_28 = local_48;
    }
  }
  iVar1 = TestCpuFlag(test_flag);
  if (iVar1 != 0) {
    if (in_stack_00000018 == 0) {
      local_28 = ScaleRowDown4_Any_AVX2;
    }
    else {
      local_28 = ScaleRowDown4Box_Any_AVX2;
    }
    if ((in_EDX & 0xf) == 0) {
      if (in_stack_00000018 == 0) {
        local_58 = ScaleRowDown4_AVX2;
      }
      else {
        local_58 = ScaleRowDown4Box_AVX2;
      }
      local_28 = local_58;
    }
  }
  if (in_stack_00000018 == 1) {
    local_14 = 0;
  }
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    (*local_28)(in_stack_00000008,(long)local_14,in_stack_00000010,in_EDX);
    in_stack_00000008 = in_stack_00000008 + (in_R8D << 2);
    in_stack_00000010 = in_stack_00000010 + in_R9D;
  }
  return;
}

Assistant:

static void ScalePlaneDown4(int src_width,
                            int src_height,
                            int dst_width,
                            int dst_height,
                            int src_stride,
                            int dst_stride,
                            const uint8_t* src_ptr,
                            uint8_t* dst_ptr,
                            enum FilterMode filtering) {
  int y;
  void (*ScaleRowDown4)(const uint8_t* src_ptr, ptrdiff_t src_stride,
                        uint8_t* dst_ptr, int dst_width) =
      filtering ? ScaleRowDown4Box_C : ScaleRowDown4_C;
  int row_stride = src_stride << 2;
  (void)src_width;
  (void)src_height;
  if (!filtering) {
    src_ptr += src_stride * 2;  // Point to row 2.
    src_stride = 0;
  }
#if defined(HAS_SCALEROWDOWN4_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_NEON : ScaleRowDown4_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_NEON : ScaleRowDown4_NEON;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_SSSE3 : ScaleRowDown4_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_SSSE3 : ScaleRowDown4_SSSE3;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_AVX2 : ScaleRowDown4_Any_AVX2;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_AVX2 : ScaleRowDown4_AVX2;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_MMI : ScaleRowDown4_Any_MMI;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_MMI : ScaleRowDown4_MMI;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_MSA : ScaleRowDown4_Any_MSA;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_MSA : ScaleRowDown4_MSA;
    }
  }
#endif

  if (filtering == kFilterLinear) {
    src_stride = 0;
  }
  for (y = 0; y < dst_height; ++y) {
    ScaleRowDown4(src_ptr, src_stride, dst_ptr, dst_width);
    src_ptr += row_stride;
    dst_ptr += dst_stride;
  }
}